

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IColourImpl * Catch::Colour::impl(void)

{
  bool bVar1;
  undefined8 local_10;
  
  bVar1 = anon_unknown_27::shouldUseColour();
  if (bVar1) {
    local_10 = anon_unknown_27::platformColourInstance();
  }
  else {
    local_10 = anon_unknown_27::NoColourImpl::instance();
  }
  return local_10;
}

Assistant:

Detail::IColourImpl* Colour::impl() {
        return shouldUseColour()
            ? platformColourInstance()
            : NoColourImpl::instance();
    }